

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_32x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  undefined8 *puVar2;
  char cVar3;
  byte bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int8_t *piVar11;
  undefined4 *puVar12;
  longlong *plVar13;
  int32_t *piVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int16_t *piVar19;
  undefined4 *puVar20;
  undefined1 extraout_XMM0 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM2 [16];
  __m128i round;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i in [512];
  undefined1 auStack_2098 [16];
  undefined1 auStack_2088 [16];
  undefined1 auStack_2078 [16];
  undefined1 auStack_2068 [16];
  undefined1 auStack_2058 [16];
  undefined1 auStack_2048 [16];
  undefined1 auStack_2038 [8];
  undefined8 uStack_2030;
  longlong local_2028 [48];
  undefined4 local_1ea8 [1952];
  
  piVar11 = av1_fwd_txfm_shift_ls[0xb];
  plVar13 = local_2028;
  iVar16 = (int)*av1_fwd_txfm_shift_ls[0xb];
  piVar19 = input + 0x1c;
  lVar15 = 0x70;
  do {
    auVar21 = pmovsxwd(in_XMM1,*(undefined8 *)(piVar19 + -0x1c));
    auVar22 = pmovsxwd(in_XMM2,*(undefined8 *)(piVar19 + -0x18));
    auVar25 = pmovsxwd(in_XMM3,*(undefined8 *)(piVar19 + -0x14));
    auVar27 = pmovsxwd(in_XMM4,*(undefined8 *)(piVar19 + -0x10));
    auVar23._0_4_ = auVar21._0_4_ << iVar16;
    auVar23._4_4_ = auVar21._4_4_;
    auVar23._8_4_ = auVar21._8_4_;
    auVar23._12_4_ = auVar21._12_4_;
    auVar28._0_4_ = auVar22._0_4_ << iVar16;
    auVar28._4_4_ = auVar22._4_4_;
    auVar28._8_4_ = auVar22._8_4_;
    auVar28._12_4_ = auVar22._12_4_;
    *(undefined1 (*) [16])(auStack_2098 + lVar15) = auVar23;
    *(undefined1 (*) [16])(auStack_2088 + lVar15) = auVar28;
    auVar22._0_4_ = auVar25._0_4_ << iVar16;
    auVar22._4_4_ = auVar25._4_4_;
    auVar22._8_4_ = auVar25._8_4_;
    auVar22._12_4_ = auVar25._12_4_;
    *(undefined1 (*) [16])(auStack_2078 + lVar15) = auVar22;
    auVar25._0_4_ = auVar27._0_4_ << iVar16;
    auVar25._4_4_ = auVar27._4_4_;
    auVar25._8_4_ = auVar27._8_4_;
    auVar25._12_4_ = auVar27._12_4_;
    *(undefined1 (*) [16])(auStack_2068 + lVar15) = auVar25;
    auVar21 = pmovsxwd(auVar23,*(undefined8 *)(piVar19 + -0xc));
    auVar23 = pmovsxwd(auVar28,*(undefined8 *)(piVar19 + -8));
    auVar22 = pmovsxwd(auVar22,*(undefined8 *)(piVar19 + -4));
    auVar28 = pmovsxwd(auVar25,*(undefined8 *)piVar19);
    in_XMM1._0_4_ = auVar21._0_4_ << iVar16;
    in_XMM1._4_4_ = auVar21._4_4_;
    in_XMM1._8_4_ = auVar21._8_4_;
    in_XMM1._12_4_ = auVar21._12_4_;
    *(undefined1 (*) [16])(auStack_2058 + lVar15) = in_XMM1;
    in_XMM2._0_4_ = auVar23._0_4_ << iVar16;
    in_XMM2._4_4_ = auVar23._4_4_;
    in_XMM2._8_4_ = auVar23._8_4_;
    in_XMM2._12_4_ = auVar23._12_4_;
    in_XMM3._0_4_ = auVar22._0_4_ << iVar16;
    in_XMM3._4_4_ = auVar22._4_4_;
    in_XMM3._8_4_ = auVar22._8_4_;
    in_XMM3._12_4_ = auVar22._12_4_;
    *(undefined1 (*) [16])(auStack_2048 + lVar15) = in_XMM2;
    *(undefined1 (*) [16])(auStack_2038 + lVar15) = in_XMM3;
    in_XMM4._0_4_ = auVar28._0_4_ << iVar16;
    in_XMM4._4_4_ = auVar28._4_4_;
    in_XMM4._8_4_ = auVar28._8_4_;
    in_XMM4._12_4_ = auVar28._12_4_;
    *(undefined1 (*) [16])((long)local_2028 + lVar15) = in_XMM4;
    lVar15 = lVar15 + 0x80;
    piVar19 = piVar19 + stride;
  } while (lVar15 != 0x2070);
  lVar15 = 0;
  do {
    uStack_2030 = 0x421356;
    av1_fdct64_sse4_1((__m128i *)((long)local_2028 + lVar15),(__m128i *)((long)local_2028 + lVar15),
                      '\r',8,8);
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x80);
  cVar3 = piVar11[1];
  lVar15 = 0;
  do {
    uStack_2030 = 0x42137a;
    col_txfm_16x16_rounding((__m128i *)((long)local_2028 + lVar15),-(int)cVar3);
    lVar15 = lVar15 + 0x400;
  } while (lVar15 != 0x2000);
  puVar12 = local_1ea8;
  piVar14 = coeff + 0xc0;
  lVar15 = 0;
  do {
    lVar17 = -0x100;
    puVar20 = puVar12;
    do {
      uVar8 = puVar20[-0x5f];
      uVar5 = puVar20[-0x3f];
      uVar9 = puVar20[-0x20];
      uVar10 = puVar20[-0x1f];
      uVar6 = *puVar20;
      uVar7 = puVar20[1];
      auVar21._0_8_ = CONCAT44(puVar20[-0x3e],puVar20[-0x5e]);
      auVar21._8_4_ = puVar20[-0x5d];
      auVar21._12_4_ = puVar20[-0x3d];
      auVar24._0_8_ = CONCAT44(puVar20[2],puVar20[-0x1e]);
      auVar24._8_4_ = puVar20[-0x1d];
      auVar24._12_4_ = puVar20[3];
      puVar2 = (undefined8 *)((long)piVar14 + lVar17 + -0x200);
      *puVar2 = CONCAT44(puVar20[-0x40],puVar20[-0x60]);
      puVar2[1] = CONCAT44(uVar6,uVar9);
      *(undefined4 *)((long)piVar14 + lVar17 + -0xf8) = uVar8;
      *(undefined4 *)((long)piVar14 + lVar17 + -0xf4) = uVar5;
      *(undefined4 *)((long)piVar14 + lVar17 + -0xf0) = uVar10;
      *(undefined4 *)((long)piVar14 + lVar17 + -0xec) = uVar7;
      auVar27._8_8_ = auVar24._0_8_;
      auVar27._0_8_ = auVar21._0_8_;
      *(undefined1 (*) [16])((long)piVar14 + lVar17) = auVar27;
      puVar2 = (undefined8 *)((long)piVar14 + lVar17 + 0x100);
      *puVar2 = auVar21._8_8_;
      puVar2[1] = auVar24._8_8_;
      puVar20 = puVar20 + 0x80;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0);
    lVar15 = lVar15 + 1;
    puVar12 = puVar12 + 4;
    piVar14 = piVar14 + 0x100;
  } while (lVar15 != 8);
  lVar15 = 0;
  do {
    uStack_2030 = 0x42144a;
    av1_fdct32_sse4_1((__m128i *)((long)coeff + lVar15),(__m128i *)((long)local_2028 + lVar15),0xb,
                      0x10);
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x100);
  lVar15 = 0;
  auVar21 = pmovsxwd(extraout_XMM0,0x16a116a116a116a1);
  auVar23 = pmovsxwd(auVar27,0x800080008000800);
  do {
    bVar4 = piVar11[2];
    iVar16 = (int)(char)bVar4;
    if (iVar16 < 0) {
      iVar18 = 1 << (~bVar4 & 0x1f);
      auVar22 = ZEXT416((uint)-iVar16);
      lVar17 = 0;
      do {
        piVar1 = (int *)((long)plVar13 + lVar17);
        auVar29._0_4_ = *piVar1 + iVar18 >> auVar22;
        auVar29._4_4_ = piVar1[1] + iVar18 >> auVar22;
        auVar29._8_4_ = piVar1[2] + iVar18 >> auVar22;
        auVar29._12_4_ = piVar1[3] + iVar18 >> auVar22;
        auVar28 = pmulld(auVar29,auVar21);
        piVar1 = (int *)((long)coeff + lVar17);
        *piVar1 = auVar28._0_4_ + auVar23._0_4_ >> 0xc;
        piVar1[1] = auVar28._4_4_ + auVar23._4_4_ >> 0xc;
        piVar1[2] = auVar28._8_4_ + auVar23._8_4_ >> 0xc;
        piVar1[3] = auVar28._12_4_ + auVar23._12_4_ >> 0xc;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x80);
    }
    else {
      lVar17 = 0;
      do {
        piVar1 = (int *)((long)plVar13 + lVar17);
        auVar26._0_4_ = *piVar1 << iVar16;
        auVar26._4_4_ = piVar1[1];
        auVar26._8_4_ = piVar1[2];
        auVar26._12_4_ = piVar1[3];
        auVar22 = pmulld(auVar26,auVar21);
        piVar1 = (int *)((long)coeff + lVar17);
        *piVar1 = auVar22._0_4_ + auVar23._0_4_ >> 0xc;
        piVar1[1] = auVar22._4_4_ + auVar23._4_4_ >> 0xc;
        piVar1[2] = auVar22._8_4_ + auVar23._8_4_ >> 0xc;
        piVar1[3] = auVar22._12_4_ + auVar23._12_4_ >> 0xc;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x80);
    }
    lVar15 = lVar15 + 1;
    coeff = coeff + 0x20;
    plVar13 = (longlong *)((long)plVar13 + 0x100);
  } while (lVar15 != 0x20);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X64];
  const int txw_idx = get_txw_idx(TX_32X64);
  const int txh_idx = get_txh_idx(TX_32X64);
  const int txfm_size_col = tx_size_wide[TX_32X64];
  const int txfm_size_row = tx_size_high[TX_32X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], txfm_size_row);
  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1((in + i), (in + i), bitcol, num_col, num_col);
  }
  for (int i = 0; i < num_col; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_row), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct32_sse4_1((outcoef128 + i), (in + i), bitrow, num_row);
  }
  for (int i = 0; i < txfm_size_col; i++) {
    av1_round_shift_rect_array_32_sse4_1(in + i * 16, outcoef128 + i * 8, 8,
                                         -shift[2], NewSqrt2);
  }
  (void)bd;
}